

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
make_trace<so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
          (deliver_op_tracer *this,char *action_name_suffix,text_separator *args,type_index *args_1,
          intrusive_ptr_t<so_5::message_t> *args_2)

{
  composed_action_name local_18;
  
  local_18.m_1 = this->m_op_name;
  local_18.m_2 = action_name_suffix;
  details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::text_separator,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (this->m_tracer,this->m_chain,&local_18,this->m_msg_type,this->m_message,args,args_1,
             args_2);
  return;
}

Assistant:

void
				make_trace(
					const char * action_name_suffix,
					ARGS &&... args ) const
					{
						details::make_trace(
								m_tracer,
								m_chain,
								details::composed_action_name{
										m_op_name, action_name_suffix },
								m_msg_type,
								m_message,
								std::forward< ARGS >(args)... );
					}